

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int resolve_scope_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int scope_level,int op,
                     DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next)

{
  undefined1 *puVar1;
  uint uVar2;
  JSVarDef *pJVar3;
  JSAtomStruct *pJVar4;
  JSClosureVar *pJVar5;
  bool bVar6;
  JSClosureVar JVar7;
  uint uVar8;
  int iVar9;
  int var_idx;
  JSVarKindEnum var_kind;
  uint uVar10;
  JSRuntime *pJVar11;
  byte bVar12;
  uint8_t uVar13;
  JSAtom JVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  size_t len;
  long lVar15;
  JSFunctionDef *pJVar16;
  JSFunctionDef *pJVar17;
  undefined4 in_register_00000084;
  LabelSlot *ls_00;
  ulong uVar18;
  JSAtom var_name_00;
  ulong uVar19;
  uint is_lexical;
  ulong uVar20;
  JSContext *pJVar21;
  bool bVar22;
  int in_stack_ffffffffffffff98;
  undefined4 local_64;
  JSAtom var_idx_00;
  ulong uVar23;
  int label_done;
  JSContext *local_48;
  undefined8 local_40;
  ulong local_38;
  ulong extraout_RDX_01;
  
  local_40 = CONCAT44(in_register_00000084,op);
  uVar20 = (ulong)var_name;
  uVar19 = (ulong)var_name;
  label_done = -1;
  bVar22 = true;
  if ((2 < var_name - 0x71) && (var_name != 8)) {
    bVar22 = false;
  }
  uVar10 = s->scopes[(uint)scope_level].first;
  uVar23 = uVar19;
  local_48 = (JSContext *)bc;
  if (-1 < (int)uVar10) {
    do {
      pJVar21 = local_48;
      pJVar3 = s->vars;
      JVar14 = (JSAtom)uVar19;
      if (pJVar3[uVar10].var_name == JVar14) {
        uVar8 = uVar10;
        if ((((int)local_40 != 0xb9) && ((int)local_40 != 0xb7)) ||
           ((pJVar3[uVar10].field_0xc & 1) == 0)) goto LAB_0015ceca;
        goto LAB_0015cf2e;
      }
      if (pJVar3[uVar10].var_name == 0x54 && !bVar22) {
        dbuf_putc((DynBuf *)local_48,'X');
        local_64 = CONCAT22(local_64._2_2_,(short)uVar10);
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
        uVar19 = uVar23;
        var_object_test(ctx,s,(JSAtom)uVar23,(int)local_40,(DynBuf *)pJVar21,&label_done,1);
        uVar20 = extraout_RDX;
        uVar23 = uVar19;
      }
      uVar10 = pJVar3[uVar10].scope_next;
    } while (-1 < (int)uVar10);
  }
  uVar8 = 0xffffffff;
  if (uVar10 != 0xfffffffe) {
    pJVar16 = (JSFunctionDef *)(uVar19 & 0xffffffff);
    uVar19 = uVar23;
    uVar8 = find_var((JSContext *)s,pJVar16,(JSAtom)uVar20);
    uVar20 = extraout_RDX_00;
    uVar23 = uVar19;
  }
  if (bVar22 && (int)uVar8 < 0) {
    JVar14 = (JSAtom)uVar19;
    uVar19 = uVar23;
    uVar8 = resolve_pseudo_var(ctx,s,JVar14);
    uVar20 = extraout_RDX_01;
    uVar23 = uVar19;
  }
  JVar14 = (JSAtom)uVar19;
  if (JVar14 == 0x4d && (int)uVar8 < 0) {
    if (s->has_arguments_binding != 0) {
      uVar8 = s->arguments_var_idx;
      if (-1 < s->arguments_var_idx) goto LAB_0015ceca;
      uVar19 = uVar23;
      uVar8 = add_var(ctx,s,0x4d);
      uVar20 = extraout_RDX_02;
      uVar23 = uVar19;
      if ((int)uVar8 < 0) goto LAB_0015cde5;
      s->arguments_var_idx = uVar8;
LAB_0015ce0d:
      JVar14 = (JSAtom)uVar23;
      goto LAB_0015ceca;
    }
LAB_0015cde5:
    pJVar21 = local_48;
    if (((s->is_func_expr != 0) && (s->func_name == (JSAtom)uVar19)) &&
       (uVar8 = add_func_var(ctx,s,(JSAtom)uVar19), uVar20 = extraout_RDX_03, uVar19 = uVar23,
       pJVar21 = local_48, -1 < (int)uVar8)) goto LAB_0015ce0d;
    local_48 = pJVar21;
    if ((uVar10 != 0xfffffffe) && (-1 < s->var_object_idx && !bVar22)) {
      dbuf_putc((DynBuf *)pJVar21,'X');
      local_64 = CONCAT22(local_64._2_2_,(short)s->var_object_idx);
      dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
      uVar19 = uVar23;
      var_object_test(ctx,s,(JSAtom)uVar23,(int)local_40,(DynBuf *)pJVar21,&label_done,0);
      uVar20 = extraout_RDX_04;
      uVar23 = uVar19;
    }
    pJVar21 = local_48;
    if (-1 < s->arg_var_object_idx && !bVar22) {
      dbuf_putc((DynBuf *)local_48,'X');
      local_64 = CONCAT22(local_64._2_2_,(short)s->arg_var_object_idx);
      dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
      uVar19 = uVar23;
      var_object_test(ctx,s,(JSAtom)uVar23,(int)local_40,(DynBuf *)pJVar21,&label_done,0);
      uVar20 = extraout_RDX_05;
      uVar23 = uVar19;
    }
    pJVar17 = s;
    for (pJVar16 = s->parent; JVar14 = (JSAtom)uVar20, pJVar16 != (JSFunctionDef *)0x0;
        pJVar16 = pJVar16->parent) {
      uVar10 = pJVar16->scopes[pJVar17->parent_scope_level].first;
      if (-1 < (int)uVar10) {
        do {
          pJVar21 = local_48;
          uVar18 = (ulong)uVar10;
          pJVar3 = pJVar16->vars;
          var_name_00 = (JSAtom)uVar19;
          if (pJVar3[uVar18].var_name == var_name_00) {
            if ((((int)local_40 != 0xb9) && ((int)local_40 != 0xb7)) ||
               ((pJVar3[uVar18].field_0xc & 1) == 0)) goto LAB_0015d7b5;
            dbuf_putc((DynBuf *)local_48,'0');
            local_64 = (int)uVar23;
            if (0xd1 < local_64) {
              pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
              (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            }
            dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
            uVar13 = '\0';
            goto LAB_0015d4e0;
          }
          if (pJVar3[uVar18].var_name == 0x54 && !bVar22) {
            pJVar3[uVar18].field_0xc = pJVar3[uVar18].field_0xc | 4;
            uVar19 = uVar23;
            iVar9 = get_closure_var2(ctx,s,pJVar16,1,0,uVar10,0x54,0,0,JS_VAR_NORMAL);
            pJVar21 = local_48;
            uVar20 = extraout_RDX_06;
            uVar23 = uVar19;
            if (-1 < iVar9) {
              dbuf_putc((DynBuf *)local_48,'^');
              local_64 = CONCAT22(local_64._2_2_,(short)iVar9);
              dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
              var_object_test(ctx,s,(JSAtom)uVar19,(int)local_40,(DynBuf *)pJVar21,&label_done,1);
              uVar20 = extraout_RDX_07;
              uVar23 = uVar19;
            }
          }
          var_name_00 = (JSAtom)uVar19;
          JVar14 = (JSAtom)uVar20;
          uVar10 = pJVar3[uVar18].scope_next;
        } while (-1 < (int)uVar10);
        if ((int)uVar8 < 0) goto joined_r0x0015d27e;
LAB_0015d5b5:
        uVar18 = (ulong)uVar8;
        goto LAB_0015d7b5;
      }
joined_r0x0015d27e:
      bVar6 = true;
      if (uVar10 != 0xfffffffe) {
        pJVar17 = (JSFunctionDef *)(uVar19 & 0xffffffff);
        uVar19 = uVar23;
        uVar8 = find_var((JSContext *)pJVar16,pJVar17,JVar14);
        uVar23 = uVar19;
        if ((int)uVar8 < 0) {
          bVar6 = false;
          uVar20 = extraout_RDX_08;
          goto LAB_0015d2ab;
        }
LAB_0015d61a:
        var_name_00 = (JSAtom)uVar23;
        uVar18 = (ulong)uVar8;
        goto LAB_0015d7b5;
      }
LAB_0015d2ab:
      if (bVar22) {
        JVar14 = (JSAtom)uVar19;
        uVar19 = uVar23;
        uVar8 = resolve_pseudo_var(ctx,pJVar16,JVar14);
        var_name_00 = (JSAtom)uVar19;
        uVar20 = extraout_RDX_09;
        uVar23 = uVar19;
        if (-1 < (int)uVar8) goto LAB_0015d5b5;
      }
      JVar14 = (JSAtom)uVar19;
      pJVar17 = pJVar16;
      if ((JVar14 == 0x4d) && (pJVar16->has_arguments_binding != 0)) {
        uVar18 = (ulong)(uint)pJVar16->arguments_var_idx;
        var_name_00 = 0x4d;
        if (-1 < pJVar16->arguments_var_idx) goto LAB_0015d7b5;
        uVar19 = uVar23;
        uVar8 = add_var(ctx,pJVar16,0x4d);
        uVar23 = uVar19;
        if (-1 < (int)uVar8) {
          pJVar16->arguments_var_idx = uVar8;
          goto LAB_0015d61a;
        }
        break;
      }
      if ((pJVar16->is_func_expr != 0) && (pJVar16->func_name == JVar14)) {
        uVar19 = uVar23;
        uVar8 = add_func_var(ctx,pJVar16,JVar14);
        var_name_00 = (JSAtom)uVar19;
        uVar18 = (ulong)uVar8;
        uVar23 = uVar19;
        if (-1 < (int)uVar8) goto LAB_0015d7b5;
        break;
      }
      if ((!bVar6) && (lVar15 = (long)pJVar16->var_object_idx, -1 < lVar15 && !bVar22)) {
        pJVar3 = pJVar16->vars;
        puVar1 = &pJVar3[lVar15].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        iVar9 = get_closure_var2(ctx,s,pJVar16,1,0,pJVar16->var_object_idx,pJVar3[lVar15].var_name,0
                                 ,0,JS_VAR_NORMAL);
        pJVar21 = local_48;
        dbuf_putc((DynBuf *)local_48,'^');
        local_64 = CONCAT22(local_64._2_2_,(short)iVar9);
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
        uVar19 = uVar23;
        var_object_test(ctx,s,(JSAtom)uVar23,(int)local_40,(DynBuf *)pJVar21,&label_done,0);
        uVar20 = extraout_RDX_10;
        uVar23 = uVar19;
      }
      lVar15 = (long)pJVar16->arg_var_object_idx;
      if (-1 < lVar15 && !bVar22) {
        pJVar3 = pJVar16->vars;
        puVar1 = &pJVar3[lVar15].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        iVar9 = get_closure_var2(ctx,s,pJVar16,1,0,pJVar16->arg_var_object_idx,
                                 pJVar3[lVar15].var_name,0,0,JS_VAR_NORMAL);
        pJVar21 = local_48;
        dbuf_putc((DynBuf *)local_48,'^');
        local_64 = CONCAT22(local_64._2_2_,(short)iVar9);
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
        uVar19 = uVar23;
        var_object_test(ctx,s,(JSAtom)uVar23,(int)local_40,(DynBuf *)pJVar21,&label_done,0);
        uVar20 = extraout_RDX_11;
        uVar23 = uVar19;
      }
      if (pJVar16->is_eval != 0) break;
    }
    var_name_00 = (JSAtom)uVar19;
    if ((pJVar17->is_eval == 0) || (iVar9 = pJVar17->closure_var_count, iVar9 < 1)) {
LAB_0015d8a7:
      pJVar21 = local_48;
      switch((int)local_40) {
      case 0xb5:
      case 0xb6:
      case 0xb7:
        uVar13 = (char)local_40 + 0x82;
        break;
      case 0xb8:
        uVar13 = 0x99;
        break;
      case 0xb9:
        if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
          bVar12 = bc_buf[ls->pos];
          if (((bVar12 < 0x1e) && ((0x22400000U >> (bVar12 & 0x1f) & 1) != 0)) || (bVar12 == 0xb1))
          {
            pos_next = optimize_scope_make_global_ref
                                 (ctx,(JSFunctionDef *)(ulong)s->js_mode,(DynBuf *)local_48,bc_buf,
                                  ls,pos_next,var_name_00);
            goto switchD_0015cef1_default;
          }
        }
        dbuf_putc((DynBuf *)local_48,'{');
        local_64 = (int)uVar23;
        if (0xd1 < (int)uVar23) {
          pJVar11 = ctx->rt;
          goto LAB_0015da1a;
        }
        goto LAB_0015da2d;
      case 0xba:
        dbuf_putc((DynBuf *)local_48,'\x06');
        uVar13 = '8';
        break;
      case 0xbb:
        uVar13 = ':';
        break;
      default:
        goto switchD_0015cef1_default;
      }
      dbuf_putc((DynBuf *)pJVar21,uVar13);
      local_64 = (int)uVar23;
      if (0xd1 < (int)uVar23) {
        pJVar11 = ctx->rt;
LAB_0015da1a:
        (pJVar11->atom_array[uVar23 & 0xffffffff]->header).ref_count =
             (pJVar11->atom_array[uVar23 & 0xffffffff]->header).ref_count + 1;
        local_64 = (int)uVar23;
      }
LAB_0015da2d:
      len = 4;
    }
    else {
      uVar20 = 0;
      do {
        pJVar5 = pJVar17->closure_var;
        uVar10 = pJVar5[uVar20].var_name;
        var_name_00 = (JSAtom)uVar19;
        var_idx = (int)uVar20;
        if (uVar10 == var_name_00) {
          if (pJVar17 != s) {
            bVar12 = *(byte *)(pJVar5 + uVar20);
            uVar10 = get_closure_var2(ctx,s,pJVar17,0,bVar12 >> 1 & 1,var_idx,(JSAtom)uVar23,
                                      bVar12 >> 2 & 1,bVar12 >> 3 & 1,(uint)(bVar12 >> 4));
            var_name_00 = (JSAtom)uVar23;
            uVar20 = (ulong)uVar10;
          }
          goto LAB_0015d85b;
        }
        if ((uVar10 & 0xfffffffe) == 0x52) {
          if (!bVar22) {
LAB_0015d6e3:
            uVar19 = uVar23;
            local_38 = uVar20;
            if (pJVar17 != s) {
              var_idx = get_closure_var2(ctx,s,pJVar17,0,*(uint *)(pJVar5 + uVar20) >> 1 & 1,var_idx
                                         ,uVar10,0,0,JS_VAR_NORMAL);
              uVar19 = uVar23;
            }
            pJVar21 = local_48;
            dbuf_putc((DynBuf *)local_48,'^');
            local_64 = CONCAT22(local_64._2_2_,(short)var_idx);
            dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
            uVar23 = uVar19;
            var_object_test(ctx,s,(JSAtom)uVar19,(int)local_40,(DynBuf *)pJVar21,&label_done,
                            (uint)(uVar10 == 0x54));
            iVar9 = pJVar17->closure_var_count;
            uVar20 = local_38;
          }
        }
        else if (uVar10 == 0x54 && !bVar22) goto LAB_0015d6e3;
        var_name_00 = (JSAtom)uVar19;
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)iVar9);
      uVar18 = (ulong)uVar8;
      pJVar16 = pJVar17;
      if ((int)uVar8 < 0) goto LAB_0015d8a7;
LAB_0015d7b5:
      uVar10 = (uint)uVar18;
      bVar22 = (uVar10 >> 0x1d & 1) != 0;
      if (bVar22) {
        uVar10 = uVar10 + 0xe0000000;
        puVar1 = &pJVar16->args[uVar10].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        var_kind = JS_VAR_NORMAL;
        is_lexical = 0;
        uVar8 = 0;
      }
      else {
        puVar1 = &pJVar16->vars[uVar18].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        uVar2 = *(uint *)&pJVar16->vars[uVar18].field_0xc;
        uVar8 = uVar2 & 1;
        is_lexical = uVar2 >> 1 & 1;
        var_kind = uVar2 >> 3 & (JS_VAR_PRIVATE_SETTER|JS_VAR_PRIVATE_GETTER);
      }
      uVar10 = get_closure_var2(ctx,s,pJVar16,1,(uint)bVar22,uVar10,var_name_00,uVar8,is_lexical,
                                var_kind);
      var_name_00 = (JSAtom)uVar23;
      uVar20 = (ulong)uVar10;
      if ((int)uVar10 < 0) goto LAB_0015d8a7;
LAB_0015d85b:
      pJVar21 = local_48;
      var_idx_00 = (JSAtom)uVar23;
      iVar9 = (int)local_40;
      uVar8 = (uint)uVar20;
      switch(iVar9) {
      case 0xb5:
      case 0xb6:
      case 0xbb:
        bVar22 = iVar9 == 0xbb;
        if ((!bVar22) && (iVar9 != 0xb7)) goto LAB_0015db06;
LAB_0015db25:
        bVar12 = *(byte *)(s->closure_var + (int)uVar8) & 8;
        uVar13 = '_';
        if (bVar12 != 0) {
          uVar13 = 'f';
        }
        if ((bVar22 & bVar12 >> 3) == 1) {
          uVar13 = (var_name_00 == 8) * '\b' + '_';
        }
        break;
      case 0xb7:
      case 0xb9:
        JVar7 = s->closure_var[(int)uVar8];
        if (((ulong)JVar7 & 4) != 0) {
          dbuf_putc((DynBuf *)local_48,'0');
          local_64 = (int)uVar23;
          if (0xd1 < local_64) {
            pJVar11 = ctx->rt;
            goto LAB_0015cf53;
          }
          goto LAB_0015cf5f;
        }
        if (iVar9 == 0xb7) {
          bVar22 = false;
          goto LAB_0015db25;
        }
        if (iVar9 == 0xb8) goto switchD_0015d885_caseD_b8;
        if (((ulong)JVar7 & 0xf0) == 0x40) {
          dbuf_putc((DynBuf *)local_48,'\v');
          dbuf_putc((DynBuf *)pJVar21,'^');
          local_64 = CONCAT22(local_64._2_2_,(short)uVar20);
          dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
          dbuf_putc((DynBuf *)pJVar21,'L');
          iVar9 = (int)uVar23;
          local_64 = iVar9;
          if (iVar9 < 0xd2) {
            dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
            dbuf_putc((DynBuf *)pJVar21,'\x04');
            local_64 = iVar9;
          }
          else {
            pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
            (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
            dbuf_putc((DynBuf *)pJVar21,'\x04');
            pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
            (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            local_64 = iVar9;
          }
          goto LAB_0015da2d;
        }
        if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
          bVar12 = bc_buf[ls->pos];
          if (((0x1d < bVar12) || ((0x22400000U >> (bVar12 & 0x1f) & 1) == 0)) && (bVar12 != 0xb1))
          goto LAB_0015dc81;
          if (((ulong)JVar7 & 8) == 0) {
            ls_00 = (LabelSlot *)0x5e;
          }
          else {
            ls_00 = (LabelSlot *)0x65;
          }
          goto LAB_0015d677;
        }
LAB_0015dc81:
        dbuf_putc((DynBuf *)local_48,'z');
        local_64 = (int)uVar23;
        if (0xd1 < local_64) {
          pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
          (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
        }
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
        goto LAB_0015db6e;
      case 0xb8:
switchD_0015d885_caseD_b8:
        uVar13 = '\t';
        goto LAB_0015cf78;
      case 0xba:
        dbuf_putc((DynBuf *)local_48,'\x06');
LAB_0015db06:
        uVar13 = 'e';
        if (((ulong)s->closure_var[(int)uVar8] & 8) == 0) {
          uVar13 = '^';
        }
        break;
      default:
        goto switchD_0015cef1_default;
      }
      dbuf_putc((DynBuf *)pJVar21,uVar13);
LAB_0015db6e:
      local_64 = CONCAT22(local_64._2_2_,(short)uVar20);
      len = 2;
    }
    dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,len);
  }
  else {
    if ((int)uVar8 < 0) goto LAB_0015cde5;
LAB_0015ceca:
    pJVar21 = local_48;
    var_idx_00 = (JSAtom)uVar23;
    iVar9 = (int)local_40;
    switch(iVar9) {
    case 0xb7:
    case 0xb9:
      if (((uVar8 >> 0x1d & 1) == 0) && ((s->vars[uVar8].field_0xc & 1) != 0)) {
LAB_0015cf2e:
        pJVar21 = local_48;
        dbuf_putc((DynBuf *)local_48,'0');
        local_64 = (int)uVar23;
        if (0xd1 < local_64) {
          pJVar11 = ctx->rt;
LAB_0015cf53:
          local_64 = (int)uVar23;
          (pJVar11->atom_array[uVar23 & 0xffffffff]->header).ref_count =
               (pJVar11->atom_array[uVar23 & 0xffffffff]->header).ref_count + 1;
        }
LAB_0015cf5f:
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
        uVar13 = '\0';
LAB_0015cf78:
        dbuf_putc((DynBuf *)pJVar21,uVar13);
        goto switchD_0015cef1_default;
      }
      if (iVar9 == 0xb7) goto switchD_0015cef1_caseD_b5;
      if (iVar9 == 0xb8) goto switchD_0015cef1_caseD_b8;
      if (((uVar8 >> 0x1d & 1) == 0) && ((*(uint *)&s->vars[uVar8].field_0xc & 0x78) == 0x20)) {
        dbuf_putc((DynBuf *)local_48,'\v');
        dbuf_putc((DynBuf *)pJVar21,'X');
        local_64 = CONCAT22(local_64._2_2_,(short)uVar8);
        dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
        dbuf_putc((DynBuf *)pJVar21,'L');
        iVar9 = (int)uVar23;
        local_64 = iVar9;
        if (iVar9 < 0xd2) {
          dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
          dbuf_putc((DynBuf *)pJVar21,'\x04');
          local_64 = iVar9;
        }
        else {
          pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
          (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
          dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
          dbuf_putc((DynBuf *)pJVar21,'\x04');
          pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
          (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
          local_64 = iVar9;
        }
        goto LAB_0015da2d;
      }
      if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
        bVar12 = bc_buf[ls->pos];
        if (((bVar12 < 0x1e) && ((0x22400000U >> (bVar12 & 0x1f) & 1) != 0)) || (bVar12 == 0xb1)) {
          if ((uVar8 >> 0x1d & 1) == 0) {
            ls_00 = (LabelSlot *)0x62;
            if ((s->vars[uVar8].field_0xc & 2) == 0) {
              ls_00 = (LabelSlot *)0x58;
            }
          }
          else {
            uVar8 = uVar8 + 0xe0000000;
            ls_00 = (LabelSlot *)0x5b;
          }
LAB_0015d677:
          pJVar21 = local_48;
          pos_next = optimize_scope_make_ref
                               (local_48,(JSFunctionDef *)bc_buf,(DynBuf *)ls,
                                (uint8_t *)(ulong)(uint)pos_next,ls_00,uVar8,
                                in_stack_ffffffffffffff98,var_idx_00);
          goto switchD_0015cef1_default;
        }
      }
      if ((uVar8 >> 0x1d & 1) == 0) {
        uVar13 = 'x';
      }
      else {
        uVar13 = 'y';
      }
      dbuf_putc((DynBuf *)local_48,uVar13);
      local_64 = (int)uVar23;
      if (0xd1 < local_64) {
        pJVar4 = ctx->rt->atom_array[uVar23 & 0xffffffff];
        (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
      }
      dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
      break;
    case 0xb8:
switchD_0015cef1_caseD_b8:
      uVar13 = '\t';
LAB_0015d4e0:
      dbuf_putc((DynBuf *)pJVar21,uVar13);
      goto switchD_0015cef1_default;
    case 0xba:
      JVar14 = var_idx_00;
      dbuf_putc((DynBuf *)local_48,'\x06');
    case 0xb5:
    case 0xb6:
    case 0xbb:
switchD_0015cef1_caseD_b5:
      if ((uVar8 >> 0x1d & 1) == 0) {
        if ((iVar9 == 0xbb) || (iVar9 == 0xb7)) {
          bVar22 = (s->vars[uVar8].field_0xc & 2) == 0;
          uVar13 = 'c';
          if (bVar22) {
            uVar13 = 'Y';
          }
          if ((!bVar22 && iVar9 == 0xbb) && (uVar13 = 'Y', JVar14 == 8)) {
            uVar13 = 'd';
          }
        }
        else {
          uVar13 = 'b';
          if ((s->vars[uVar8].field_0xc & 2) == 0) {
            uVar13 = 'X';
          }
        }
      }
      else {
        uVar13 = ((iVar9 - 0xb7U & 0xfffffffb) == 0) + '[';
      }
      dbuf_putc((DynBuf *)pJVar21,uVar13);
      break;
    default:
      goto switchD_0015cef1_default;
    }
    local_64 = CONCAT22(local_64._2_2_,(short)uVar8);
    dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,2);
  }
switchD_0015cef1_default:
  iVar9 = label_done;
  lVar15 = (long)label_done;
  if (-1 < lVar15) {
    dbuf_putc((DynBuf *)pJVar21,0xb4);
    local_64 = iVar9;
    dbuf_put((DynBuf *)pJVar21,(uint8_t *)&local_64,4);
    s->label_slots[lVar15].pos2 = *(int *)&(pJVar21->header).link.prev;
  }
  return pos_next;
}

Assistant:

static int resolve_scope_var(JSContext *ctx, JSFunctionDef *s,
                             JSAtom var_name, int scope_level, int op,
                             DynBuf *bc, uint8_t *bc_buf,
                             LabelSlot *ls, int pos_next)
{
    int idx, var_idx, is_put;
    int label_done;
    JSFunctionDef *fd;
    JSVarDef *vd;
    BOOL is_pseudo_var, is_arg_scope;

    label_done = -1;

    /* XXX: could be simpler to use a specific function to
       resolve the pseudo variables */
    is_pseudo_var = (var_name == JS_ATOM_home_object ||
                     var_name == JS_ATOM_this_active_func ||
                     var_name == JS_ATOM_new_target ||
                     var_name == JS_ATOM_this);

    /* resolve local scoped variables */
    var_idx = -1;
    for (idx = s->scopes[scope_level].first; idx >= 0;) {
        vd = &s->vars[idx];
        if (vd->var_name == var_name) {
            if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                if (vd->is_const) {
                    dbuf_putc(bc, OP_throw_error);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, JS_THROW_VAR_RO);
                    goto done;
                }
            }
            var_idx = idx;
            break;
        } else
        if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
            dbuf_putc(bc, OP_get_loc);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
        }
        idx = vd->scope_next;
    }
    is_arg_scope = (idx == ARG_SCOPE_END);
    if (var_idx < 0) {
        /* argument scope: variables are not visible but pseudo
           variables are visible */
        if (!is_arg_scope) {
            var_idx = find_var(ctx, s, var_name);
        }

        if (var_idx < 0 && is_pseudo_var)
            var_idx = resolve_pseudo_var(ctx, s, var_name);

        if (var_idx < 0 && var_name == JS_ATOM_arguments &&
            s->has_arguments_binding) {
            /* 'arguments' pseudo variable */
            var_idx = add_arguments_var(ctx, s);
        }
        if (var_idx < 0 && s->is_func_expr && var_name == s->func_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, s, var_name);
        }
    }
    if (var_idx >= 0) {
        if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
            !(var_idx & ARGUMENT_VAR_OFFSET) &&
            s->vars[var_idx].is_const) {
            /* only happens when assigning a function expression name
               in strict mode */
            dbuf_putc(bc, OP_throw_error);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            dbuf_putc(bc, JS_THROW_VAR_RO);
            goto done;
        }
        /* OP_scope_put_var_init is only used to initialize a
           lexical variable, so it is never used in a with or var object. It
           can be used with a closure (module global variable case). */
        switch (op) {
        case OP_scope_make_ref:
            if (!(var_idx & ARGUMENT_VAR_OFFSET) &&
                s->vars[var_idx].var_kind == JS_VAR_FUNCTION_NAME) {
                /* Create a dummy object reference for the func_var */
                dbuf_putc(bc, OP_object);
                dbuf_putc(bc, OP_get_loc);
                dbuf_put_u16(bc, var_idx);
                dbuf_putc(bc, OP_define_field);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, OP_push_atom_value);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            } else
            if (label_done == -1 && can_opt_put_ref_value(bc_buf, ls->pos)) {
                int get_op;
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    get_op = OP_get_arg;
                    var_idx -= ARGUMENT_VAR_OFFSET;
                } else {
                    if (s->vars[var_idx].is_lexical)
                        get_op = OP_get_loc_check;
                    else
                        get_op = OP_get_loc;
                }
                pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                   pos_next, get_op, var_idx);
            } else {
                /* Create a dummy object with a named slot that is
                   a reference to the local variable */
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    dbuf_putc(bc, OP_make_arg_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
                } else {
                    dbuf_putc(bc, OP_make_loc_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx);
                }
            }
            break;
        case OP_scope_get_ref:
            dbuf_putc(bc, OP_undefined);
            /* fall thru */
        case OP_scope_get_var_undef:
        case OP_scope_get_var:
        case OP_scope_put_var:
        case OP_scope_put_var_init:
            is_put = (op == OP_scope_put_var || op == OP_scope_put_var_init);
            if (var_idx & ARGUMENT_VAR_OFFSET) {
                dbuf_putc(bc, OP_get_arg + is_put);
                dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
            } else {
                if (is_put) {
                    if (s->vars[var_idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_loc_check_init);
                            else
                                dbuf_putc(bc, OP_put_loc);
                        } else {
                            dbuf_putc(bc, OP_put_loc_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_loc);
                    }
                } else {
                    if (s->vars[var_idx].is_lexical) {
                        dbuf_putc(bc, OP_get_loc_check);
                    } else {
                        dbuf_putc(bc, OP_get_loc);
                    }
                }
                dbuf_put_u16(bc, var_idx);
            }
            break;
        case OP_scope_delete_var:
            dbuf_putc(bc, OP_push_false);
            break;
        }
        goto done;
    }
    /* check eval object */
    if (!is_arg_scope && s->var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }
    /* check eval object in argument scope */
    if (s->arg_var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->arg_var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }

    /* check parent scopes */
    for (fd = s; fd->parent;) {
        scope_level = fd->parent_scope_level;
        fd = fd->parent;
        for (idx = fd->scopes[scope_level].first; idx >= 0;) {
            vd = &fd->vars[idx];
            if (vd->var_name == var_name) {
                if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                    if (vd->is_const) {
                        dbuf_putc(bc, OP_throw_error);
                        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                        dbuf_putc(bc, JS_THROW_VAR_RO);
                        goto done;
                    }
                }
                var_idx = idx;
                break;
            } else if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
                vd->is_captured = 1;
                idx = get_closure_var(ctx, s, fd, FALSE, idx, vd->var_name, FALSE, FALSE, JS_VAR_NORMAL);
                if (idx >= 0) {
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
                }
            }
            idx = vd->scope_next;
        }
        is_arg_scope = (idx == ARG_SCOPE_END);
        if (var_idx >= 0)
            break;
        
        if (!is_arg_scope) {
            var_idx = find_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (is_pseudo_var) {
            var_idx = resolve_pseudo_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (var_name == JS_ATOM_arguments && fd->has_arguments_binding) {
            var_idx = add_arguments_var(ctx, fd);
            break;
        }
        if (fd->is_func_expr && fd->func_name == var_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, fd, var_name);
            break;
        }

        /* check eval object */
        if (!is_arg_scope && fd->var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }

        /* check eval object in argument scope */
        if (fd->arg_var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->arg_var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->arg_var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }
        
        if (fd->is_eval)
            break; /* it it necessarily the top level function */
    }

    /* check direct eval scope (in the closure of the eval function
       which is necessarily at the top level) */
    if (!fd)
        fd = s;
    if (var_idx < 0 && fd->is_eval) {
        int idx1;
        for (idx1 = 0; idx1 < fd->closure_var_count; idx1++) {
            JSClosureVar *cv = &fd->closure_var[idx1];
            if (var_name == cv->var_name) {
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, cv->is_const,
                                           cv->is_lexical, cv->var_kind);
                } else {
                    idx = idx1;
                }
                goto has_idx;
            } else if ((cv->var_name == JS_ATOM__var_ ||
                        cv->var_name == JS_ATOM__arg_var_ ||
                        cv->var_name == JS_ATOM__with_) && !is_pseudo_var) {
                int is_with = (cv->var_name == JS_ATOM__with_);
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, FALSE, FALSE,
                                           JS_VAR_NORMAL);
                } else {
                    idx = idx1;
                }
                dbuf_putc(bc, OP_get_var_ref);
                dbuf_put_u16(bc, idx);
                var_object_test(ctx, s, var_name, op, bc, &label_done, is_with);
            }
        }
    }

    if (var_idx >= 0) {
        /* find the corresponding closure variable */
        if (var_idx & ARGUMENT_VAR_OFFSET) {
            fd->args[var_idx - ARGUMENT_VAR_OFFSET].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  TRUE, var_idx - ARGUMENT_VAR_OFFSET,
                                  var_name, FALSE, FALSE, JS_VAR_NORMAL);
        } else {
            fd->vars[var_idx].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  FALSE, var_idx,
                                  var_name,
                                  fd->vars[var_idx].is_const,
                                  fd->vars[var_idx].is_lexical,
                                  fd->vars[var_idx].var_kind);
        }
        if (idx >= 0) {
        has_idx:
            if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
                s->closure_var[idx].is_const) {
                dbuf_putc(bc, OP_throw_error);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, JS_THROW_VAR_RO);
                goto done;
            }
            switch (op) {
            case OP_scope_make_ref:
                if (s->closure_var[idx].var_kind == JS_VAR_FUNCTION_NAME) {
                    /* Create a dummy object reference for the func_var */
                    dbuf_putc(bc, OP_object);
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    dbuf_putc(bc, OP_define_field);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, OP_push_atom_value);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                } else
                if (label_done == -1 &&
                    can_opt_put_ref_value(bc_buf, ls->pos)) {
                    int get_op;
                    if (s->closure_var[idx].is_lexical)
                        get_op = OP_get_var_ref_check;
                    else
                        get_op = OP_get_var_ref;
                    pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                       pos_next,
                                                       get_op, idx);
                } else {
                    /* Create a dummy object with a named slot that is
                       a reference to the closure variable */
                    dbuf_putc(bc, OP_make_var_ref_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, idx);
                }
                break;
            case OP_scope_get_ref:
                /* XXX: should create a dummy object with a named slot that is
                   a reference to the closure variable */
                dbuf_putc(bc, OP_undefined);
                /* fall thru */
            case OP_scope_get_var_undef:
            case OP_scope_get_var:
            case OP_scope_put_var:
            case OP_scope_put_var_init:
                is_put = (op == OP_scope_put_var ||
                          op == OP_scope_put_var_init);
                if (is_put) {
                    if (s->closure_var[idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_var_ref_check_init);
                            else
                                dbuf_putc(bc, OP_put_var_ref);
                        } else {
                            dbuf_putc(bc, OP_put_var_ref_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_var_ref);
                    }
                } else {
                    if (s->closure_var[idx].is_lexical) {
                        dbuf_putc(bc, OP_get_var_ref_check);
                    } else {
                        dbuf_putc(bc, OP_get_var_ref);
                    }
                }
                dbuf_put_u16(bc, idx);
                break;
            case OP_scope_delete_var:
                dbuf_putc(bc, OP_push_false);
                break;
            }
            goto done;
        }
    }

    /* global variable access */

    switch (op) {
    case OP_scope_make_ref:
        if (label_done == -1 && can_opt_put_global_ref_value(bc_buf, ls->pos)) {
            pos_next = optimize_scope_make_global_ref(ctx, s, bc, bc_buf, ls,
                                                      pos_next, var_name);
        } else {
            dbuf_putc(bc, OP_make_var_ref);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        }
        break;
    case OP_scope_get_ref:
        /* XXX: should create a dummy object with a named slot that is
           a reference to the global variable */
        dbuf_putc(bc, OP_undefined);
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_get_var_undef:
    case OP_scope_get_var:
    case OP_scope_put_var:
        dbuf_putc(bc, OP_get_var_undef + (op - OP_scope_get_var_undef));
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_put_var_init:
        dbuf_putc(bc, OP_put_var_init);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_delete_var:
        dbuf_putc(bc, OP_delete_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    }
done:
    if (label_done >= 0) {
        dbuf_putc(bc, OP_label);
        dbuf_put_u32(bc, label_done);
        s->label_slots[label_done].pos2 = bc->size;
    }
    return pos_next;
}